

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O3

void findAllTextureWidgetsRecursively(QWidget *tlw,QWidget *widget)

{
  QWidgetPrivate *this;
  QWidget **ppQVar1;
  int iVar2;
  QPlatformTextureList *this_00;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  _Head_base<0UL,_QPlatformTextureList_*,_false> local_50;
  QList<QWidget_*> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(*(long *)&widget->field_0x8 + 0x253) & 2) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = (QWidget **)0x0;
    local_48.d.size = 0;
    this_00 = (QPlatformTextureList *)operator_new(0x10);
    QPlatformTextureList::QPlatformTextureList(this_00,(QObject *)0x0);
    local_50._M_head_impl = this_00;
    findTextureWidgetsRecursively(tlw,widget,this_00,&local_48);
    iVar2 = QPlatformTextureList::count();
    if (iVar2 != 0) {
      this = *(QWidgetPrivate **)&tlw->field_0x8;
      QWidgetPrivate::createTLExtra(this);
      std::
      vector<std::unique_ptr<QPlatformTextureList,std::default_delete<QPlatformTextureList>>,std::allocator<std::unique_ptr<QPlatformTextureList,std::default_delete<QPlatformTextureList>>>>
      ::
      emplace_back<std::unique_ptr<QPlatformTextureList,std::default_delete<QPlatformTextureList>>>
                ((vector<std::unique_ptr<QPlatformTextureList,std::default_delete<QPlatformTextureList>>,std::allocator<std::unique_ptr<QPlatformTextureList,std::default_delete<QPlatformTextureList>>>>
                  *)((long)(((this->extra)._M_t.
                             super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                           super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 200),
                 (unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_> *)
                 &local_50);
    }
    ppQVar1 = local_48.d.ptr;
    if (local_48.d.size != 0) {
      lVar4 = local_48.d.size << 3;
      lVar3 = 0;
      do {
        if ((*(byte *)(*(long *)&(*(QWidget **)((long)ppQVar1 + lVar3))->field_0x8 + 0x253) & 2) !=
            0) {
          findAllTextureWidgetsRecursively(tlw,*(QWidget **)((long)ppQVar1 + lVar3));
        }
        lVar3 = lVar3 + 8;
      } while (lVar4 != lVar3);
    }
    if (local_50._M_head_impl != (QPlatformTextureList *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 0x20))();
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void findAllTextureWidgetsRecursively(QWidget *tlw, QWidget *widget)
{
    // textureChildSeen does not take native child widgets into account and that's good.
    if (QWidgetPrivate::get(widget)->textureChildSeen) {
        QList<QWidget *> nativeChildren;
        auto tl = std::make_unique<QPlatformTextureList>();
        // Look for texture widgets (incl. widget itself) from 'widget' down,
        // but skip subtrees with a parent of a native child widget.
        findTextureWidgetsRecursively(tlw, widget, tl.get(), &nativeChildren);
        // tl may be empty regardless of textureChildSeen if we have native or hidden children.
        if (!tl->isEmpty())
            QWidgetPrivate::get(tlw)->topData()->widgetTextures.push_back(std::move(tl));
        // Native child widgets, if there was any, get their own separate QPlatformTextureList.
        for (QWidget *ncw : std::as_const(nativeChildren)) {
            if (QWidgetPrivate::get(ncw)->textureChildSeen)
                findAllTextureWidgetsRecursively(tlw, ncw);
        }
    }
}